

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_data.hpp
# Opt level: O3

void duckdb::ArrowListData<long>::AppendOffsets
               (ArrowAppendData *append_data,UnifiedVectorFormat *format,idx_t from,idx_t to,
               vector<unsigned_int,_true> *child_sel)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  long lVar4;
  iterator __position;
  reference this;
  long lVar5;
  ulong uVar6;
  idx_t iVar7;
  idx_t iVar8;
  data_ptr_t pdVar9;
  long local_68;
  uint local_5c;
  idx_t local_58;
  UnifiedVectorFormat *local_50;
  ArrowAppendData *local_48;
  idx_t local_40;
  data_ptr_t local_38;
  
  local_58 = from;
  this = vector<duckdb::ArrowBuffer,_true>::operator[](&append_data->arrow_buffers,1);
  iVar7 = this->count + (to - from) * 8 + 8;
  ArrowBuffer::reserve(this,iVar7);
  this->count = iVar7;
  local_38 = format->data;
  pdVar1 = this->dataptr;
  if (append_data->row_count == 0) {
    pdVar1[0] = '\0';
    pdVar1[1] = '\0';
    pdVar1[2] = '\0';
    pdVar1[3] = '\0';
    pdVar1[4] = '\0';
    pdVar1[5] = '\0';
    pdVar1[6] = '\0';
    pdVar1[7] = '\0';
  }
  if (local_58 < to) {
    local_68 = *(long *)(pdVar1 + append_data->row_count * 8);
    uVar6 = local_58;
    iVar7 = local_58;
    local_50 = format;
    local_48 = append_data;
    local_40 = to;
    do {
      psVar2 = format->sel->sel_vector;
      iVar8 = iVar7;
      if (psVar2 != (sel_t *)0x0) {
        iVar8 = (idx_t)psVar2[iVar7];
      }
      lVar5 = local_48->row_count + (iVar7 - uVar6) + 1;
      puVar3 = (format->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((puVar3[iVar8 >> 6] >> (iVar8 & 0x3f) & 1) != 0)) {
        lVar4 = *(long *)(local_38 + iVar8 * 0x10 + 8);
        local_68 = local_68 + lVar4;
        *(long *)(pdVar1 + lVar5 * 8) = local_68;
        format = local_50;
        if (lVar4 != 0) {
          pdVar9 = local_38 + iVar8 * 0x10;
          lVar5 = 0;
          do {
            local_5c = (int)*(undefined8 *)pdVar9 + (int)lVar5;
            __position._M_current =
                 (child_sel->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (child_sel->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&child_sel->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
                         __position,&local_5c);
            }
            else {
              *__position._M_current = local_5c;
              (child_sel->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            lVar5 = lVar5 + 1;
            uVar6 = local_58;
            format = local_50;
            to = local_40;
          } while (lVar4 != lVar5);
        }
      }
      else {
        *(long *)(pdVar1 + lVar5 * 8) = local_68;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != to);
  }
  return;
}

Assistant:

static void AppendOffsets(ArrowAppendData &append_data, UnifiedVectorFormat &format, idx_t from, idx_t to,
	                          vector<sel_t> &child_sel) {
		// resize the offset buffer - the offset buffer holds the offsets into the child array
		idx_t size = to - from;
		auto &main_buffer = append_data.GetMainBuffer();

		main_buffer.resize(main_buffer.size() + sizeof(BUFTYPE) * (size + 1));
		auto data = UnifiedVectorFormat::GetData<list_entry_t>(format);
		auto offset_data = main_buffer.GetData<BUFTYPE>();
		if (append_data.row_count == 0) {
			// first entry
			offset_data[0] = 0;
		}
		// set up the offsets using the list entries
		auto last_offset = offset_data[append_data.row_count];
		for (idx_t i = from; i < to; i++) {
			auto source_idx = format.sel->get_index(i);
			auto offset_idx = append_data.row_count + i + 1 - from;

			if (!format.validity.RowIsValid(source_idx)) {
				offset_data[offset_idx] = last_offset;
				continue;
			}

			// append the offset data
			auto list_length = data[source_idx].length;
			if (std::is_same<BUFTYPE, int32_t>::value == true &&
			    (uint64_t)last_offset + list_length > NumericLimits<int32_t>::Maximum()) {
				throw InvalidInputException(
				    "Arrow Appender: The maximum combined list offset for regular list buffers is "
				    "%u but the offset of %lu exceeds this.\n* SET arrow_large_buffer_size=true to use large list "
				    "buffers",
				    NumericLimits<int32_t>::Maximum(), last_offset);
			}
			last_offset += list_length;
			offset_data[offset_idx] = last_offset;

			for (idx_t k = 0; k < list_length; k++) {
				child_sel.push_back(UnsafeNumericCast<sel_t>(data[source_idx].offset + k));
			}
		}
	}